

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void __thiscall mjs::print_visitor::operator()(print_visitor *this,binary_expression *e)

{
  token_type tt;
  long *plVar1;
  expression *e_00;
  int iVar2;
  char *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  wostream *pwVar6;
  wchar_t local_2c;
  version local_28;
  wchar_t local_24;
  
  iVar2 = operator_precedence(e->op_);
  print_with_parentheses
            (this,(e->lhs_)._M_t.
                  super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t
                  .super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,iVar2);
  tt = e->op_;
  pwVar6 = this->os_;
  if (tt == dot) {
    plVar1 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      local_24 = (**(code **)(*plVar1 + 0x50))(plVar1,0x2e);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar6,&stack0xffffffffffffffdc,1);
      iVar2 = (**(code **)((long)(((e->rhs_)._M_t.
                                   super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                   .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl)->
                                 super_syntax_node)._vptr_syntax_node + 0x18))();
      e_00 = (e->rhs_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      if ((iVar2 != 2) || (*(int *)&e_00[1].super_syntax_node._vptr_syntax_node != 4)) {
        accept<mjs::print_visitor>(e_00,this);
        return;
      }
      pwVar6 = this->os_;
      peVar5 = e_00[1].super_syntax_node.extend_.file.
               super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&e_00[1].super_syntax_node.extend_ + 8))->_M_pi;
LAB_00126aff:
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (pwVar6,(wchar_t *)peVar5,(long)p_Var4);
      return;
    }
  }
  else {
    if (tt != lbracket) {
      pcVar3 = op_text(tt);
      std::operator<<(pwVar6,pcVar3);
      print_with_parentheses
                (this,(e->rhs_)._M_t.
                      super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                      .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,iVar2);
      return;
    }
    plVar1 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      local_2c = (**(code **)(*plVar1 + 0x50))(plVar1,0x5b);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar6,&local_2c,1);
      accept<mjs::print_visitor>
                ((e->rhs_)._M_t.
                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
      pwVar6 = this->os_;
      plVar1 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        local_28 = (**(code **)(*plVar1 + 0x50))(plVar1,0x5d);
        peVar5 = (element_type *)&stack0xffffffffffffffd8;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        goto LAB_00126aff;
      }
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void operator()(const binary_expression& e) {
        const int precedence = operator_precedence(e.op());
        print_with_parentheses(e.lhs(), precedence);
        if (e.op() == token_type::lbracket) {
            os_ << '[';
            accept(e.rhs(), *this);
            os_ << ']';
        } else if (e.op() == token_type::dot) {
            os_ << '.';
            if (e.rhs().type() == expression_type::literal) {
                if (const auto& t = static_cast<const literal_expression&>(e.rhs()).t(); t.type() == token_type::string_literal) {
                    os_ << t.text();
                    return;
                }
            }
            accept(e.rhs(), *this);
        } else {
            os_ << op_text(e.op());
            print_with_parentheses(e.rhs(), precedence);
        }
    }